

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replicode_common.h
# Opt level: O0

P<r_exec::TDecompiler> * __thiscall
core::P<r_exec::TDecompiler>::operator=(P<r_exec::TDecompiler> *this,TDecompiler *c)

{
  TDecompiler *c_local;
  P<r_exec::TDecompiler> *this_local;
  
  if ((TDecompiler *)this->object != c) {
    if (this->object != (_Object *)0x0) {
      _Object::decRef(this->object);
    }
    this->object = &c->super__Object;
    if (this->object != (_Object *)0x0) {
      _Object::incRef(this->object);
    }
  }
  return this;
}

Assistant:

P<C> &operator =(C *c)
    {
        if (object == c) {
            return *this;
        }

        if (object) {
            object->decRef();
        }

        object = c;

        if (object) {
            object->incRef();
        }

        return *this;
    }